

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_layer_t.h
# Opt level: O0

void __thiscall
pool_layer_t::pool_layer_t(pool_layer_t *this,uint16_t stride,uint16_t extend_filter,tdsize in_size)

{
  float fVar1;
  undefined8 in_RCX;
  ushort in_DX;
  ushort in_SI;
  long in_RDI;
  float fVar2;
  tensor_t<float> *in_stack_ffffffffffffff50;
  tensor_t<float> *in_stack_ffffffffffffff58;
  tensor_t<float> *in_stack_ffffffffffffff60;
  layer_type in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  tensor_t<float> *in_stack_ffffffffffffff80;
  int local_10;
  int iStack_c;
  
  tensor_t<float>::tensor_t
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff74);
  tensor_t<float>::tensor_t
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff74);
  iStack_c = (int)((ulong)in_RCX >> 0x20);
  tensor_t<float>::tensor_t
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff74);
  layer_t::layer_t((layer_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                   in_stack_ffffffffffffff50);
  tensor_t<float>::~tensor_t((tensor_t<float> *)0x1033dc);
  tensor_t<float>::~tensor_t((tensor_t<float> *)0x1033e6);
  tensor_t<float>::~tensor_t((tensor_t<float> *)0x1033f3);
  *(ushort *)(in_RDI + 0x7c) = in_SI;
  *(ushort *)(in_RDI + 0x7e) = in_DX;
  local_10 = (int)in_RCX;
  fVar1 = (float)(int)(local_10 - (uint)in_DX) / (float)in_SI + 1.0;
  fVar2 = (float)((int)(local_10 - (uint)in_DX) / (int)(uint)in_SI + 1);
  if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
    __assert_fail("(float(in_size.x - extend_filter) / stride + 1) == ((in_size.x - extend_filter) / stride + 1)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/acstud[P]lab3-cnn/src/cnn/pool_layer_t.h"
                  ,0x18,"pool_layer_t::pool_layer_t(uint16_t, uint16_t, tdsize)");
  }
  fVar1 = (float)(int)(iStack_c - (uint)in_DX) / (float)in_SI + 1.0;
  fVar2 = (float)((int)(iStack_c - (uint)in_DX) / (int)(uint)in_SI + 1);
  if ((fVar1 == fVar2) && (!NAN(fVar1) && !NAN(fVar2))) {
    return;
  }
  __assert_fail("(float(in_size.y - extend_filter) / stride + 1) == ((in_size.y - extend_filter) / stride + 1)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/acstud[P]lab3-cnn/src/cnn/pool_layer_t.h"
                ,0x1a,"pool_layer_t::pool_layer_t(uint16_t, uint16_t, tdsize)");
}

Assistant:

pool_layer_t(uint16_t stride, uint16_t extend_filter, tdsize in_size)
      : layer_t(layer_type::pool,
                tensor_t<float>(in_size.x, in_size.y, in_size.z),
                tensor_t<float>(in_size.x, in_size.y, in_size.z),
                tensor_t<float>((in_size.x - extend_filter) / stride + 1,
                                (in_size.y - extend_filter) / stride + 1,
                                in_size.z)) {
    this->stride = stride;
    this->extend_filter = extend_filter;
    assert((float(in_size.x - extend_filter) / stride + 1) == ((in_size.x - extend_filter) / stride + 1));

    assert((float(in_size.y - extend_filter) / stride + 1) == ((in_size.y - extend_filter) / stride + 1));
  }